

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

interval_t
duckdb::BinaryLambdaWrapperWithNulls::
Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
          (timestamp_t param_1,timestamp_t param_2,_Head_base<0UL,_unsigned_long_*,_false> *param_3,
          ulong param_4)

{
  byte bVar1;
  _Head_base<0UL,_unsigned_long_*,_false> _Var2;
  _Head_base<0UL,_unsigned_long_*,_false> _Var3;
  TemplatedValidityData<unsigned_long> *pTVar4;
  _Head_base<0UL,_unsigned_long_*,_false> _Var5;
  interval_t iVar6;
  _Head_base<0UL,_unsigned_long_*,_false> local_38;
  _Head_base<0UL,_unsigned_long_*,_false> _Stack_30;
  _Head_base<0UL,_unsigned_long_*,_false> local_28;
  
  if ((((param_1.value == -0x7fffffffffffffff) || (param_1.value == 0x7fffffffffffffff)) ||
      (param_2.value == -0x7fffffffffffffff)) || (param_2.value == 0x7fffffffffffffff)) {
    _Var5._M_head_impl = param_3->_M_head_impl;
    if (_Var5._M_head_impl == (unsigned_long *)0x0) {
      local_28._M_head_impl = param_3[3]._M_head_impl;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_38,(unsigned_long *)&local_28);
      _Var3._M_head_impl = _Stack_30._M_head_impl;
      _Var2._M_head_impl = local_38._M_head_impl;
      local_38._M_head_impl = (unsigned_long *)0x0;
      _Stack_30._M_head_impl = (unsigned_long *)0x0;
      _Var5._M_head_impl = param_3[2]._M_head_impl;
      param_3[1]._M_head_impl = _Var2._M_head_impl;
      param_3[2]._M_head_impl = _Var3._M_head_impl;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_head_impl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_head_impl);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_30._M_head_impl !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_30._M_head_impl);
        }
      }
      pTVar4 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                          (param_3 + 1));
      _Var5._M_head_impl =
           (pTVar4->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      param_3->_M_head_impl = _Var5._M_head_impl;
    }
    bVar1 = (byte)param_4 & 0x3f;
    _Var5._M_head_impl[param_4 >> 6] =
         _Var5._M_head_impl[param_4 >> 6] & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
    iVar6 = (interval_t)ZEXT816(0);
  }
  else {
    iVar6 = Interval::GetAge(param_1,param_2);
  }
  return iVar6;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right, mask, idx);
	}